

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O0

DataNode *
neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::Locator::NewDataNode
          (LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL> *ht,int *key,int *mapped)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference this;
  DataNode *ptr;
  DataNodeQueue *queue;
  uint32_t tid;
  int *mapped_local;
  int *key_local;
  LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL> *ht_local;
  
  uVar2 = FASTER::core::Thread::id();
  sVar3 = std::
          vector<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
          ::size(&ht->data_pool_);
  if (uVar2 <= sVar3) {
    this = std::
           vector<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
           ::operator[](&ht->data_pool_,(ulong)uVar2);
    bVar1 = NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>::
            Empty(this);
    if (bVar1) {
      ht_local = (LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL> *)operator_new(0x30);
      DataNode::DataNode((DataNode *)ht_local,key,mapped);
    }
    else {
      ht_local = (LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL> *)
                 NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>
                 ::Pop(this);
      *(NodeType *)
       &(ht_local->data_pool_).
        super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = Data;
      DataBlock::init((DataBlock *)
                      &(ht_local->data_pool_).
                       super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<int,_int,_std::hash<int>,_4UL,_4UL>::DataNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)key);
    }
    return (DataNode *)ht_local;
  }
  __assert_fail("tid <= ht.data_pool_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/test/../neatlib/lock_free_hash_table.h"
                ,99,
                "static DataNode *neatlib::LockFreeHashTable<int, int>::Locator::NewDataNode(LockFreeHashTable<Key, T, Hash, HASH_LEVEL, ROOT_HASH_LEVEL> &, const Key &, const T &) [Key = int, T = int, Hash = std::hash<int>, HASH_LEVEL = 4, ROOT_HASH_LEVEL = 4]"
               );
}

Assistant:

inline static DataNode *NewDataNode(LockFreeHashTable &ht, const Key &key, const T &mapped) {
            uint32_t tid = FASTER::core::Thread::id();
            assert(tid <= ht.data_pool_.size());
            DataNodeQueue &queue = ht.data_pool_[tid];
            if (!queue.Empty()) {
                DataNode *ptr = queue.Pop();
                ptr->type = NodeType::Data;
                ptr->data.init(key, mapped);
                return ptr;
            }
            return new DataNode(key, mapped);
        }